

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::~SQGenerator(SQGenerator *this)

{
  SQGenerator *this_local;
  
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQGenerator_00215570;
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
  }
  sqvector<SQExceptionTrap>::~sqvector(&this->_etraps);
  SQVM::CallInfo::~CallInfo(&this->_ci);
  sqvector<SQObjectPtr>::~sqvector(&this->_stack);
  ::SQObjectPtr::~SQObjectPtr(&this->_closure);
  SQCollectable::~SQCollectable(&this->super_SQCollectable);
  return;
}

Assistant:

~SQGenerator()
    {
        REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
    }